

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::AddLinkLibrary(cmMakefile *this,string *lib,LinkLibraryType llt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LibraryID tmp;
  value_type local_40;
  
  paVar1 = &local_40.first.field_2;
  local_40.first._M_string_length = 0;
  local_40.first.field_2._M_local_buf[0] = '\0';
  local_40.second = GENERAL;
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_assign((string *)&local_40);
  local_40.second = llt;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
  ::push_back(&this->LinkLibraries,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,
                    CONCAT71(local_40.first.field_2._M_allocated_capacity._1_7_,
                             local_40.first.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefile::AddLinkLibrary(const std::string& lib,
                                cmTarget::LinkLibraryType llt)
{
  cmTarget::LibraryID tmp;
  tmp.first = lib;
  tmp.second = llt;
  this->LinkLibraries.push_back(tmp);
}